

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

uint32_t WriteBinaryAnim(aiAnimation *anim)

{
  uint uVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  long lVar3;
  ulong uVar4;
  uint32_t n;
  uint32_t t;
  undefined4 local_28;
  uint local_24;
  
  _local_28 = CONCAT44((uint)((ulong)in_RAX >> 0x20),0x123b);
  fwrite(&local_28,4,1,(FILE *)out);
  fwrite(&local_28,4,1,(FILE *)out);
  lVar3 = ftell((FILE *)out);
  uVar1 = (anim->mName).length;
  fwrite(anim,4,1,(FILE *)out);
  fwrite((anim->mName).data,(ulong)uVar1,1,(FILE *)out);
  fwrite(&anim->mDuration,8,1,(FILE *)out);
  fwrite(&anim->mTicksPerSecond,8,1,(FILE *)out);
  _local_28 = CONCAT44(anim->mNumChannels,local_28);
  fwrite(&local_24,4,1,(FILE *)out);
  n = uVar1 + 0x18;
  if (anim->mNumChannels != 0) {
    uVar4 = 0;
    do {
      uVar2 = WriteBinaryNodeAnim(anim->mChannels[uVar4]);
      n = n + uVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar4 < anim->mNumChannels);
  }
  ChangeInteger((int)lVar3 - 4,n);
  return n;
}

Assistant:

uint32_t WriteBinaryAnim(const aiAnimation* anim)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIANIMATION);

	len += Write<aiString> (anim->mName);
	len += Write<double> (anim->mDuration);
	len += Write<double> (anim->mTicksPerSecond);
	len += Write<unsigned int>(anim->mNumChannels);

	for (unsigned int a = 0; a < anim->mNumChannels;++a) {
		const aiNodeAnim* nd = anim->mChannels[a];
		len += WriteBinaryNodeAnim(nd)+8;	
	}

	ChangeInteger(old,len);
	return len;
}